

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcOffsetCurve2D,_3UL>::Construct
                   (DB *db,LIST *params)

{
  IfcOffsetCurve2D *in;
  
  in = (IfcOffsetCurve2D *)operator_new(0x78);
  *(undefined ***)&in->field_0x60 = &PTR__Object_008d12a0;
  *(undefined8 *)&in->field_0x68 = 0;
  *(char **)&in->field_0x70 = "IfcOffsetCurve2D";
  Assimp::IFC::Schema_2x3::IfcCurve::IfcCurve((IfcCurve *)in,&PTR_construction_vtable_24__00975448);
  *(undefined8 *)&(in->super_IfcCurve).field_0x38 = 0;
  *(undefined8 *)&(in->super_IfcCurve).field_0x40 = 0;
  (in->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcOffsetCurve2D_00975390;
  *(undefined ***)&in->field_0x60 = &PTR__IfcOffsetCurve2D_00975430;
  *(undefined ***)
   &(in->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcOffsetCurve2D_009753b8;
  *(undefined ***)
   &(in->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcOffsetCurve2D_009753e0;
  *(undefined ***)&(in->super_IfcCurve).super_IfcGeometricRepresentationItem.field_0x30 =
       &PTR__IfcOffsetCurve2D_00975408;
  (in->SelfIntersect).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (in->SelfIntersect).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcOffsetCurve2D>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcCurve).super_IfcGeometricRepresentationItem.
                 super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
               .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }